

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall dxil_spv::Converter::Impl::add(Impl *this,Operation *op,bool is_rov)

{
  vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_> *pvVar1;
  Operation *local_30;
  Operation *local_28;
  byte local_19;
  Operation *pOStack_18;
  bool is_rov_local;
  Operation *op_local;
  Impl *this_local;
  
  local_19 = is_rov;
  pOStack_18 = op;
  op_local = (Operation *)this;
  if (this->current_block != (Vector<Operation_*> *)0x0) {
    if (is_rov) {
      pvVar1 = this->current_block;
      local_28 = allocate(this,OpBeginInvocationInterlockEXT);
      std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
      push_back(pvVar1,&local_28);
    }
    std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
    push_back(this->current_block,&stack0xffffffffffffffe8);
    if ((local_19 & 1) != 0) {
      pvVar1 = this->current_block;
      local_30 = allocate(this,OpEndInvocationInterlockEXT);
      std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
      push_back(pvVar1,&local_30);
    }
    return;
  }
  __assert_fail("current_block",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                ,0x1ecd,"void dxil_spv::Converter::Impl::add(Operation *, bool)");
}

Assistant:

void Converter::Impl::add(Operation *op, bool is_rov)
{
	assert(current_block);
	if (is_rov)
		current_block->push_back(allocate(spv::OpBeginInvocationInterlockEXT));
	current_block->push_back(op);
	if (is_rov)
		current_block->push_back(allocate(spv::OpEndInvocationInterlockEXT));
}